

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O1

void __thiscall Assimp::ColladaParser::ReadLightLibrary(ColladaParser *this)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  mapped_type *pLight;
  undefined4 extraout_var_01;
  string id;
  allocator local_51;
  key_type local_50;
  
  iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if (((char)iVar1 == '\0') &&
     (iVar1 = (*this->mReader->_vptr_IIrrXMLReader[2])(), (char)iVar1 != '\0')) {
    do {
      iVar1 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar1 == 1) {
        if (iVar2 != 1) {
          __assert_fail("mReader->getNodeType() == irr::io::EXN_ELEMENT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Collada/ColladaParser.h"
                        ,0x178,"bool Assimp::ColladaParser::IsElement(const char *) const");
        }
        iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar1 = strcmp((char *)CONCAT44(extraout_var,iVar1),"light");
        if (iVar1 == 0) {
          uVar3 = GetAttribute(this,"id");
          iVar1 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar3);
          std::__cxx11::string::string
                    ((string *)&local_50,(char *)CONCAT44(extraout_var_00,iVar1),&local_51);
          pLight = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Light,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Light>_>_>
                   ::operator[](&this->mLightLibrary,&local_50);
          pLight->mType = 0;
          (pLight->mColor).r = 0.0;
          (pLight->mColor).g = 0.0;
          (pLight->mColor).b = 0.0;
          pLight->mAttConstant = 1.0;
          pLight->mAttLinear = 0.0;
          pLight->mAttQuadratic = 0.0;
          pLight->mFalloffAngle = 180.0;
          pLight->mFalloffExponent = 0.0;
          pLight->mPenumbraAngle = 1e+09;
          pLight->mOuterAngle = 1e+09;
          pLight->mIntensity = 1.0;
          ReadLight(this,pLight);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
        }
        else {
          SkipElement(this);
        }
      }
      else if (iVar2 == 2) {
        iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar1 = strcmp((char *)CONCAT44(extraout_var_01,iVar1),"library_lights");
        if (iVar1 == 0) {
          return;
        }
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"Expected end of <library_lights> element.","");
        ThrowException(this,&local_50);
      }
      iVar1 = (*this->mReader->_vptr_IIrrXMLReader[2])();
    } while ((char)iVar1 != '\0');
  }
  return;
}

Assistant:

void ColladaParser::ReadLightLibrary()
{
    if (mReader->isEmptyElement())
        return;

    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT) {
            if (IsElement("light"))
            {
                // read ID. By now you probably know my opinion about this "specification"
                int attrID = GetAttribute("id");
                std::string id = mReader->getAttributeValue(attrID);

                // create an entry and store it in the library under its ID
                ReadLight(mLightLibrary[id] = Light());

            }
            else
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END) {
            if (strcmp(mReader->getNodeName(), "library_lights") != 0)
                ThrowException("Expected end of <library_lights> element.");

            break;
        }
    }
}